

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall
QGraphicsDropShadowEffect::~QGraphicsDropShadowEffect(QGraphicsDropShadowEffect *this)

{
  ~QGraphicsDropShadowEffect(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

QGraphicsEffect::~QGraphicsEffect()
{
    Q_D(QGraphicsEffect);
    d->setGraphicsEffectSource(nullptr);
}